

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cc
# Opt level: O2

ValueLimits
google::protobuf::compiler::cpp::EnumGenerator::ValueLimits::FromEnum(EnumDescriptor *descriptor)

{
  EnumValueDescriptor *pEVar1;
  EnumValueDescriptor *pEVar2;
  EnumValueDescriptor *pEVar3;
  int i;
  int index;
  ValueLimits VVar4;
  
  pEVar1 = EnumDescriptor::value(descriptor,0);
  pEVar2 = EnumDescriptor::value(descriptor,0);
  for (index = 1; index < descriptor->value_count_; index = index + 1) {
    pEVar3 = EnumDescriptor::value(descriptor,index);
    if (pEVar3->number_ < pEVar1->number_) {
      pEVar1 = EnumDescriptor::value(descriptor,index);
    }
    pEVar3 = EnumDescriptor::value(descriptor,index);
    if (pEVar2->number_ < pEVar3->number_) {
      pEVar2 = EnumDescriptor::value(descriptor,index);
    }
  }
  VVar4.max = pEVar2;
  VVar4.min = pEVar1;
  return VVar4;
}

Assistant:

EnumGenerator::ValueLimits EnumGenerator::ValueLimits::FromEnum(
    const EnumDescriptor* descriptor) {
  const EnumValueDescriptor* min_desc = descriptor->value(0);
  const EnumValueDescriptor* max_desc = descriptor->value(0);

  for (int i = 1; i < descriptor->value_count(); ++i) {
    if (descriptor->value(i)->number() < min_desc->number()) {
      min_desc = descriptor->value(i);
    }
    if (descriptor->value(i)->number() > max_desc->number()) {
      max_desc = descriptor->value(i);
    }
  }

  return EnumGenerator::ValueLimits{min_desc, max_desc};
}